

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshCacheItem::Write(ON_MeshCacheItem *this,ON_BinaryArchive *archive)

{
  element_type *o;
  bool bVar1;
  bool bVar2;
  
  o = (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (o == (element_type *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
    if (bVar1) {
      bVar2 = ON_BinaryArchive::WriteUuid(archive,&this->m_mesh_id);
      if (bVar2) {
        bVar1 = ON_BinaryArchive::WriteObject(archive,(ON_Object *)o);
      }
      else {
        bVar1 = false;
      }
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
      bVar2 = (bool)(bVar2 & bVar1);
    }
  }
  return bVar2;
}

Assistant:

static void Internal_PrintMeshArrayHash(ON_TextLog& text_log, const ON_SimpleArray<ON_3fPoint>& a, const wchar_t* prefix, bool bNewLine)
{
  ON_SHA1 sha1;
  ON_SHA1_Accumulate3fPointArray(sha1,a);
  const ON_SHA1_Hash hash = sha1.Hash();
  Internal_PrintMeshArrayHash(text_log, hash, prefix, bNewLine);
}